

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::VariableDatum::Decode(VariableDatum *this,KDataStream *stream)

{
  ulong uVar1;
  pointer *ppDVar2;
  pointer pDVar3;
  iterator __position;
  KUINT16 KVar4;
  uint uVar5;
  KException *this_00;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  KOCTET o;
  DatumEntry de;
  KOCTET local_61;
  KString local_60;
  vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>>
  *local_40;
  VariableDatum *local_38;
  
  KVar4 = KDataStream::GetBufferSize(stream);
  if (KVar4 < 8) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Decode","");
    KException::KException(this_00,&local_60,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pDVar3 = (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_v8DatumValue).
      super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish != pDVar3) {
    (this->m_v8DatumValue).
    super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pDVar3;
  }
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32DatumID);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32DatumLength);
  dVar9 = ceil((double)this->m_ui32DatumLength * 0.125);
  dVar9 = ceil(dVar9 * 0.125);
  uVar6 = (uint)(long)(dVar9 * 8.0);
  if (uVar6 != 0) {
    local_40 = (vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>>
                *)&this->m_v8DatumValue;
    uVar5 = 0;
    local_38 = this;
    do {
      local_60._M_dataplus._M_p = (pointer)0x0;
      if ((uVar5 & 0xffff) < uVar6) {
        uVar7 = 0;
        do {
          KDataStream::Read(stream,&local_61);
          *(KOCTET *)((long)&local_60._M_dataplus._M_p + uVar7) = local_61;
          uVar1 = uVar7 + 1;
          if (uVar6 <= ((uVar5 & 0xffff) + (int)uVar7 + 1 & 0xffff)) break;
          bVar8 = uVar7 < 7;
          uVar7 = uVar1;
        } while (bVar8);
        uVar5 = (int)uVar1 + uVar5;
        this = local_38;
      }
      __position._M_current =
           (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_v8DatumValue).
          super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>>
        ::_M_realloc_insert<KDIS::DATA_TYPE::VariableDatum::DatumEntry_const&>
                  (local_40,__position,(DatumEntry *)&local_60);
      }
      else {
        *(pointer *)(__position._M_current)->Buffer = local_60._M_dataplus._M_p;
        ppDVar2 = &(this->m_v8DatumValue).
                   super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar2 = *ppDVar2 + 1;
      }
    } while ((uVar5 & 0xffff) < uVar6);
  }
  return;
}

Assistant:

void VariableDatum::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < VARIABLE_DATUM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_v8DatumValue.clear();

    stream >> m_ui32DatumID
           >> m_ui32DatumLength;

    KUINT32 ui32LengthInOctets = ceil(ceil(m_ui32DatumLength / 8.0) / 8.0) * 8;

    // Datum length is returned in bits, so we need to convert to octets
    for( KUINT16 i = 0; i < ui32LengthInOctets; )
    {
        DatumEntry de;

        for( KUINT16 j = 0; i < ui32LengthInOctets && j < 8; ++j, ++i )
        {
            KOCTET o;
            stream >> o;
            de.Buffer[j] = o;
        }
        m_v8DatumValue.push_back( de );
    }
}